

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

Transform * __thiscall
lunasvg::SVGMarkerElement::markerTransform
          (Transform *__return_storage_ptr__,SVGMarkerElement *this,Point *origin,float angle,
          float strokeWidth)

{
  MarkerUnits MVar1;
  OrientType OVar2;
  float angle_00;
  Point local_68;
  Point local_60;
  Point refOrigin;
  undefined1 local_50 [8];
  Transform viewTransform;
  Transform transform;
  float strokeWidth_local;
  float angle_local;
  Point *origin_local;
  SVGMarkerElement *this_local;
  
  Transform::translated((Transform *)&viewTransform.m_matrix.e,origin->x,origin->y);
  OVar2 = SVGAngle::orientType(&this->m_orient);
  if (OVar2 == Angle) {
    angle_00 = SVGAngle::value(&this->m_orient);
    Transform::rotate((Transform *)&viewTransform.m_matrix.e,angle_00,0.0,0.0);
  }
  else {
    Transform::rotate((Transform *)&viewTransform.m_matrix.e,angle,0.0,0.0);
  }
  refOrigin = (Point)markerSize(this);
  SVGFitToViewBox::viewBoxToViewTransform
            ((Transform *)local_50,&this->super_SVGFitToViewBox,(Size *)&refOrigin);
  local_68 = refPoint(this);
  local_60 = Transform::mapPoint((Transform *)local_50,&local_68);
  MVar1 = SVGEnumeration<lunasvg::MarkerUnits>::value(&this->m_markerUnits);
  if (MVar1 == StrokeWidth) {
    Transform::scale((Transform *)&viewTransform.m_matrix.e,strokeWidth,strokeWidth);
  }
  Transform::translate((Transform *)&viewTransform.m_matrix.e,-local_60.x,-local_60.y);
  Transform::operator*
            (__return_storage_ptr__,(Transform *)&viewTransform.m_matrix.e,(Transform *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Transform SVGMarkerElement::markerTransform(const Point& origin, float angle, float strokeWidth) const
{
    auto transform = Transform::translated(origin.x, origin.y);
    if(m_orient.orientType() == SVGAngle::OrientType::Angle) {
        transform.rotate(m_orient.value());
    } else {
        transform.rotate(angle);
    }

    auto viewTransform = viewBoxToViewTransform(markerSize());
    auto refOrigin = viewTransform.mapPoint(refPoint());
    if(m_markerUnits.value() == MarkerUnits::StrokeWidth)
        transform.scale(strokeWidth, strokeWidth);
    transform.translate(-refOrigin.x, -refOrigin.y);
    return transform * viewTransform;
}